

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  string *psVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  allocator local_1f2;
  allocator local_1f1;
  string local_1f0;
  string RepoGenOpt;
  string BinCreatorOpt;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&BinCreatorOpt,"CPACK_IFW_BINARYCREATOR_EXECUTABLE",
             (allocator *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&RepoGenOpt,"CPACK_IFW_REPOGEN_EXECUTABLE",(allocator *)&cmCPackLog_msg);
  bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&BinCreatorOpt);
  if ((!bVar3) ||
     (bVar3 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&RepoGenOpt), !bVar3)) {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&BinCreatorOpt);
  if (pcVar5 != (char *)0x0) {
    cmSystemTools::IsNOTFOUND(pcVar5);
  }
  std::__cxx11::string::assign((char *)&this->BinCreator);
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x119,local_1f0._M_dataplus._M_p);
  }
  else {
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&RepoGenOpt);
    if (pcVar5 != (char *)0x0) {
      cmSystemTools::IsNOTFOUND(pcVar5);
    }
    std::__cxx11::string::assign((char *)&this->RepoGen);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_FRAMEWORK_VERSION",(allocator *)&local_1f0);
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&this->FrameworkVersion);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES",(allocator *)&local_1f0
              );
    bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    this->ResolveDuplicateNames = bVar3;
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->PkgsDirsVector);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_PACKAGES_DIRECTORIES",(allocator *)&local_1f0);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,(allocator *)&local_1f0);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&this->PkgsDirsVector,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    (this->Installer).Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_IFW_DOWNLOAD_ALL",(allocator *)&local_1f0);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_DOWNLOAD_ALL",(allocator *)&local_1f0);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (pcVar5 != (char *)0x0) {
        bVar3 = cmSystemTools::IsOn(pcVar5);
        goto LAB_0028962f;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar3 = cmSystemTools::IsOn(pcVar5);
LAB_0028962f:
      this->OnlineOnly = bVar3;
    }
    if (((this->Installer).Repositories.
         super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->Installer).Repositories.
         super__Vector_base<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
         ._M_impl.super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CMAKE_EXECUTABLE_SUFFIX",(allocator *)&local_1f0);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      psVar1 = &this->ExecutableSuffix;
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::string::assign((char *)psVar1);
      }
      else {
        std::__cxx11::string::assign((char *)psVar1);
        if ((this->ExecutableSuffix)._M_string_length == 0) {
          std::__cxx11::string::string((string *)&local_1f0,"CMAKE_SYSTEM_NAME",&local_1f1);
          pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1f0);
          std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar5,&local_1f2);
          std::__cxx11::string::~string((string *)&local_1f0);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmCPackLog_msg,"Linux");
          if (bVar3) {
            std::__cxx11::string::assign((char *)psVar1);
          }
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
      }
      iVar4 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      goto LAB_0028979c;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
                            );
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                    ,0x158,local_1f0._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  iVar4 = 0;
LAB_0028979c:
  std::__cxx11::string::~string((string *)&RepoGenOpt);
  std::__cxx11::string::~string((string *)&BinCreatorOpt);
  return iVar4;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";

  if(!this->IsSet(BinCreatorOpt) ||
     !this->IsSet(RepoGenOpt))
    {
    this->ReadListFile("CPackIFW.cmake");
    }

  // Look 'binarycreator' executable (needs)

  const char *BinCreatorStr = this->GetOption(BinCreatorOpt);
  if(!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr))
    {
    BinCreator = "";
    }
  else
    {
    BinCreator = BinCreatorStr;
    }

  if (BinCreator.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find QtIFW compiler \"binarycreator\": "
                  "likely it is not installed, or not in your PATH"
                  << std::endl);
    return 0;
    }

  // Look 'repogen' executable (optional)

  const char *RepoGenStr = this->GetOption(RepoGenOpt);
  if(!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr))
    {
    RepoGen = "";
    }
  else
    {
    RepoGen = RepoGenStr;
    }

  // Framework version
  if(const char* FrameworkVersionSrt =
      this->GetOption("CPACK_IFW_FRAMEWORK_VERSION"))
    {
    FrameworkVersion = FrameworkVersionSrt;
    }
  else
    {
    FrameworkVersion = "1.9.9";
    }

  // Variables that Change Behavior

  // Resolve duplicate names
  ResolveDuplicateNames = this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  PkgsDirsVector.clear();
  if(const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES"))
    {
    cmSystemTools::ExpandListArgument(dirs,
                                      PkgsDirsVector);
    }

  // Installer
  Installer.Generator = this;
  Installer.ConfigureFromOptions();

  if (const char* ifwDownloadAll =
      this->GetOption("CPACK_IFW_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
    }
  else if (const char* cpackDownloadAll =
           this->GetOption("CPACK_DOWNLOAD_ALL"))
    {
    OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
    }
  else
    {
    OnlineOnly = false;
    }

  if (!Installer.Repositories.empty() && RepoGen.empty()) {
  cmCPackLogger(cmCPackLog::LOG_ERROR,
                "Cannot find QtIFW repository generator \"repogen\": "
                "likely it is not installed, or not in your PATH"
                << std::endl);
  return 0;
  }

  // Executable suffix
  if(const char *optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX"))
    {
    ExecutableSuffix = optExeSuffix;
    if(ExecutableSuffix.empty())
      {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if(sysName == "Linux")
        {
        ExecutableSuffix = ".run";
        }
      }
    }
  else
    {
    ExecutableSuffix = cmCPackGenerator::GetOutputExtension();
    }

  return this->Superclass::InitializeInternal();
}